

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgradientreconstruction.cpp
# Opt level: O2

void __thiscall
TPZGradientReconstruction::TPZGradientData::Print(TPZGradientData *this,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  char string [256];
  
  std::operator<<(out,"\n\n");
  lVar2 = 0;
  sprintf(string,"\t%s","Cell average");
  std::operator<<(out,string);
  sprintf(string,"\t%s","Center Point");
  std::operator<<(out,string);
  sprintf(string,"\t\t%s","Gradient");
  std::operator<<(out,string);
  sprintf(string,"\t\t%s","Slope limiter");
  std::operator<<(out,string);
  std::operator<<(out,"\n");
  builtin_strncpy(string,"Cel",4);
  std::operator<<(out,string);
  std::operator<<(out,"\t");
  std::ostream::_M_insert<double>
            (*(this->fSolCellAndNeighbors).super_TPZManVector<double,_10>.super_TPZVec<double>.
              fStore);
  std::operator<<(out,"\t(");
  for (; lVar2 != 3; lVar2 = lVar2 + 1) {
    sprintf(string,"%f",
            (((this->fCenterPointCellAndNeighbors).super_TPZManVector<TPZManVector<double,_3>,_10>.
              super_TPZVec<TPZManVector<double,_3>_>.fStore)->super_TPZVec<double>).fStore[lVar2]);
    std::operator<<(out,string);
    if (lVar2 != 2) {
      std::operator<<(out,",");
    }
  }
  std::operator<<(out,")");
  std::operator<<(out,"\t(");
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    std::ostream::_M_insert<double>((this->fGradient).super_TPZVec<double>.fStore[lVar2]);
    if (lVar2 != 2) {
      std::operator<<(out,",");
    }
  }
  std::operator<<(out,")");
  std::operator<<(out,"\t");
  poVar1 = std::ostream::_M_insert<double>(this->fSlopeLimiter);
  std::operator<<(poVar1,"\n");
  for (lVar2 = 1;
      lVar2 < (this->fSolCellAndNeighbors).super_TPZManVector<double,_10>.super_TPZVec<double>.
              fNElements; lVar2 = lVar2 + 1) {
    poVar1 = std::operator<<(out,"Neigh");
    std::ostream::operator<<(poVar1,(int)lVar2);
    std::operator<<(out,"\t");
    std::ostream::_M_insert<double>
              ((this->fSolCellAndNeighbors).super_TPZManVector<double,_10>.super_TPZVec<double>.
               fStore[lVar2]);
    std::operator<<(out,"\t(");
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      std::ostream::_M_insert<double>
                ((this->fCenterPointCellAndNeighbors).
                 super_TPZManVector<TPZManVector<double,_3>,_10>.
                 super_TPZVec<TPZManVector<double,_3>_>.fStore[lVar2].super_TPZVec<double>.fStore
                 [lVar3]);
      if (lVar3 != 2) {
        std::operator<<(out,",");
      }
    }
    std::operator<<(out,")\n");
  }
  poVar1 = std::operator<<(out,"\n\n");
  poVar1 = std::operator<<(poVar1,"Center Point Interface");
  std::operator<<(poVar1,"\n");
  for (lVar2 = 0;
      lVar2 < (this->fCenterPointInterface).super_TPZManVector<TPZManVector<double,_3>,_10>.
              super_TPZVec<TPZManVector<double,_3>_>.fNElements; lVar2 = lVar2 + 1) {
    std::operator<<(out,"(");
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      sprintf(string,"%f",
              (this->fCenterPointInterface).super_TPZManVector<TPZManVector<double,_3>,_10>.
              super_TPZVec<TPZManVector<double,_3>_>.fStore[lVar2].super_TPZVec<double>.fStore
              [lVar3]);
      std::operator<<(out,string);
      if (lVar3 != 2) {
        std::operator<<(out,",");
      }
    }
    std::operator<<(out,")\n");
  }
  return;
}

Assistant:

void TPZGradientReconstruction::TPZGradientData::Print(std::ostream &out) const
{
    const char *name1 = "Cell average";
    const char *name2 = "Center Point";
    const char *name3 = "Gradient";
    const char *name4 = "Slope limiter";
    
    const char *name5 = "Cel";
    const char *name6 = "Neigh";
    const char *name7 = "Center Point Interface";
    
    char string[256];
    
    out<<"\n\n";
    sprintf(string, "\t%s", name1);
    out << string ;
    sprintf(string, "\t%s", name2);
    out << string ;
    sprintf(string, "\t\t%s", name3);
    out << string ;
    sprintf(string, "\t\t%s", name4);
    out << string ;
    out<<"\n";
    
    sprintf(string, "%s", name5);
    out << string ;
    
    out << "\t" ;
    out << fSolCellAndNeighbors[0];
    
    int i, j;
    out<<"\t(";
    for(j=0; j<3; j++ ){
        sprintf(string, "%f", fCenterPointCellAndNeighbors[0][j]);
        out << string;
        if (j<2) out<<",";
    }
    out <<")";
    
    out<<"\t(";
    for(i=0; i<3; i++ ){
        out << fGradient[i];
        if (i<2) out<<",";
    }
    out <<")";
    
    out << "\t" << fSlopeLimiter << "\n";
    
    
    for (i=1; i<fSolCellAndNeighbors.size(); i++)
    {
        out << name6 <<i;
        
        out << "\t" << fSolCellAndNeighbors[i];
        
        out<<"\t(";
        for(j=0; j<3; j++ ){
            out << fCenterPointCellAndNeighbors[i][j];
            if (j<2) out<<",";
        }
        out <<")\n";
    }
    //Interface
    out <<"\n\n" << name7 <<"\n";
    for (i=0; i<fCenterPointInterface.size(); i++)
    {
        out<<"(";
        for(j=0; j<3; j++ ){
            sprintf(string, "%f", fCenterPointInterface[i][j]);
            out << string;
            if (j<2) out<<",";
        }
        out <<")\n";
    }
    
}